

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O3

MPP_RET vepu510_h265_setup_hal_bufs(H265eV510HalContext *ctx)

{
  uint uVar1;
  Vepu541Fmt VVar2;
  VepuFmtCfg *cfg;
  MppEncCfgSet *pMVar3;
  MppEncRefCfg ref;
  MppEncCfgSet *pMVar4;
  MppEncCpbInfo *pMVar5;
  int iVar6;
  MPP_RET MVar7;
  uint uVar8;
  int iVar9;
  MppBuffer *buffer;
  RK_S32 RVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  size_t local_58;
  long local_50;
  long local_48;
  long local_40;
  
  cfg = (VepuFmtCfg *)ctx->input_fmt;
  pMVar3 = ctx->cfg;
  ref = pMVar3->ref_cfg;
  uVar1 = ctx->max_buf_cnt;
  iVar16 = (pMVar3->prep).width;
  pMVar4 = pMVar3;
  RVar10 = iVar16;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0x138);
    RVar10 = (pMVar3->prep).width;
    pMVar4 = ctx->cfg;
  }
  iVar6 = RVar10 + 0x7e;
  if (-1 < RVar10 + 0x3f) {
    iVar6 = RVar10 + 0x3f;
  }
  iVar11 = (pMVar3->prep).height;
  iVar15 = iVar11 + 0x7e;
  if (-1 < iVar11 + 0x3f) {
    iVar15 = iVar11 + 0x3f;
  }
  vepu541_set_fmt(cfg,(pMVar4->prep).format);
  VVar2 = cfg->format;
  if (VVar2 < VEPU580_FMT_BUTT) {
    uVar14 = (iVar11 + 0xfU & 0xffffff0) * (RVar10 + 0xfU & 0xfffffff0);
    switch(VVar2) {
    case VEPU541_FMT_BGRA8888:
      uVar14 = uVar14 * 4;
      break;
    case VEPU541_FMT_BGR888:
    case VEPU580_FMT_YUV444SP:
    case VEPU580_FMT_YUV444P:
      uVar14 = uVar14 * 3;
      break;
    default:
      uVar14 = uVar14 * 2;
      break;
    case VEPU541_FMT_NONE:
    case VEPU540_FMT_BUTT:
      goto switchD_0025cfef_caseD_3;
    case VEPU541_FMT_YUV420SP:
    case VEPU541_FMT_YUV420P:
      uVar14 = uVar14 * 3 >> 1;
      break;
    case VEPU540_FMT_YUV400:
      break;
    }
    uVar8 = iVar16 + 0x1f;
    if (ref == (MppEncRefCfg)0x0) {
      uVar12 = 4;
    }
    else {
      pMVar5 = mpp_enc_ref_cfg_get_cpb_info(ref);
      uVar12 = 4;
      if (2 < pMVar5->dpb_size) {
        uVar12 = (ulong)(pMVar5->dpb_size + 1);
      }
    }
    if ((int)(uVar8 & 0xffffffe0) < 0x1001) {
      clear_ext_line_bufs(ctx);
      uVar8 = 0;
      if (ctx->ext_line_buf_grp != (MppBufferGroup)0x0) {
        mpp_buffer_group_clear(ctx->ext_line_buf_grp);
        mpp_buffer_group_put(ctx->ext_line_buf_grp);
        ctx->ext_line_buf_grp = (MppBufferGroup)0x0;
        uVar8 = 0;
      }
    }
    else {
      uVar8 = (uVar8 >> 5) * 0x1b0 - 0xbdc0 & 0xffffff00;
      if (ctx->ext_line_buf_grp == (MppBufferGroup)0x0) {
        mpp_buffer_group_get
                  (&ctx->ext_line_buf_grp,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h265e_v510",
                   "vepu510_h265_setup_hal_bufs");
      }
      else if (uVar8 != ctx->ext_line_buf_size) {
        clear_ext_line_bufs(ctx);
        mpp_buffer_group_clear(ctx->ext_line_buf_grp);
      }
      if ((ctx->ext_line_buf_grp == (MppBufferGroup)0x0) &&
         (_mpp_log_l(2,"hal_h265e_v510","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "ctx->ext_line_buf_grp","vepu510_h265_setup_hal_bufs",0x16c),
         (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
      iVar16 = ctx->task_cnt;
      if (0 < iVar16) {
        buffer = ctx->ext_line_bufs;
        lVar13 = 0;
        do {
          if (*buffer == (MppBuffer)0x0) {
            mpp_buffer_get_with_tag
                      (ctx->ext_line_buf_grp,buffer,(long)ctx->ext_line_buf_size,"hal_h265e_v510",
                       "setup_ext_line_bufs");
            iVar16 = ctx->task_cnt;
          }
          lVar13 = lVar13 + 1;
          buffer = buffer + 1;
        } while (lVar13 < iVar16);
      }
    }
    ctx->ext_line_buf_size = uVar8;
    if ((ctx->frame_size < uVar14) || ((int)uVar1 < (int)uVar12)) {
      iVar11 = (pMVar3->prep).width;
      iVar9 = (pMVar3->prep).height;
      iVar16 = iVar11 + 0x1f;
      iVar11 = iVar11 + 0x3e;
      if (-1 < iVar16) {
        iVar11 = iVar16;
      }
      iVar16 = iVar9 + 0x1f;
      iVar9 = iVar9 + 0x3e;
      if (-1 < iVar16) {
        iVar9 = iVar16;
      }
      hal_bufs_deinit(ctx->dpb_bufs);
      hal_bufs_init(&ctx->dpb_bufs);
      iVar16 = ((iVar15 >> 6) + 1) * (iVar6 >> 6);
      uVar8 = iVar16 * 0x40 + 0x1fffU & 0xffffe000;
      ctx->fbc_header_len = uVar8;
      local_58 = (size_t)(int)((iVar16 * 0x3000 >> 1) + uVar8);
      local_50 = (long)(iVar16 * 0x100);
      local_48 = (long)(int)(iVar16 * 0x400 + 0xff0U & 0xfffff000);
      local_40 = (long)(int)(((iVar9 >> 5) + 0xfU & 0xffffff0) * ((iVar11 >> 5) + 0xfU & 0xfffffff0)
                            );
      if ((int)uVar12 <= (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      if (((byte)hal_h265e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h265e_v510","frame size %d -> %d max count %d -> %d\n",(char *)0x0,
                   (ulong)ctx->frame_size,(ulong)uVar14,(ulong)uVar1,uVar12);
      }
      hal_bufs_setup(ctx->dpb_bufs,(RK_S32)uVar12,4,&local_58);
      ctx->frame_size = uVar14;
      ctx->max_buf_cnt = (RK_S32)uVar12;
    }
    MVar7 = MPP_OK;
    if (((byte)hal_h265e_debug & 4) != 0) {
      MVar7 = MPP_OK;
      _mpp_log_l(4,"hal_h265e_v510","(%d) leave\n",(char *)0x0,0x192);
    }
  }
  else {
switchD_0025cfef_caseD_3:
    _mpp_log_l(2,"hal_h265e_v510","invalid src color space: %d\n","vepu510_h265_setup_hal_bufs");
    MVar7 = MPP_NOK;
  }
  return MVar7;
}

Assistant:

static MPP_RET vepu510_h265_setup_hal_bufs(H265eV510HalContext *ctx)
{
    MPP_RET ret = MPP_OK;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    RK_U32 frame_size;
    Vepu541Fmt input_fmt = VEPU541_FMT_YUV420P;
    RK_S32 mb_wd64, mb_h64;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    RK_S32 old_max_cnt = ctx->max_buf_cnt;
    RK_S32 new_max_cnt = 4;
    RK_S32 alignment = 32;
    RK_S32 aligned_w = MPP_ALIGN(prep->width,  alignment);

    hal_h265e_enter();

    mb_wd64 = (prep->width + 63) / 64;
    mb_h64 = (prep->height + 63) / 64 + 1;

    frame_size = MPP_ALIGN(prep->width, 16) * MPP_ALIGN(prep->height, 16);
    vepu541_set_fmt(fmt, ctx->cfg->prep.format);
    input_fmt = (Vepu541Fmt)fmt->format;
    switch (input_fmt) {
    case VEPU540_FMT_YUV400:
        break;
    case VEPU541_FMT_YUV420P:
    case VEPU541_FMT_YUV420SP: {
        frame_size = frame_size * 3 / 2;
    } break;
    case VEPU541_FMT_YUV422P:
    case VEPU541_FMT_YUV422SP:
    case VEPU541_FMT_YUYV422:
    case VEPU541_FMT_UYVY422:
    case VEPU541_FMT_BGR565: {
        frame_size *= 2;
    } break;
    case VEPU541_FMT_BGR888:
    case VEPU580_FMT_YUV444SP:
    case VEPU580_FMT_YUV444P: {
        frame_size *= 3;
    } break;
    case VEPU541_FMT_BGRA8888: {
        frame_size *= 4;
    } break;
    default: {
        hal_h265e_err("invalid src color space: %d\n", input_fmt);
        return MPP_NOK;
    }
    }

    if (ref_cfg) {
        MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
        new_max_cnt = MPP_MAX(new_max_cnt, info->dpb_size + 1);
    }

    if (aligned_w > SZ_4K) {
        RK_S32 ctu_w = (aligned_w + 31) / 32;
        RK_S32 ext_line_buf_size = ((ctu_w - 113) * 27 + 15) / 16 * 16 * 16;

        if (NULL == ctx->ext_line_buf_grp)
            mpp_buffer_group_get_internal(&ctx->ext_line_buf_grp, MPP_BUFFER_TYPE_ION);
        else if (ext_line_buf_size != ctx->ext_line_buf_size) {
            clear_ext_line_bufs(ctx);
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
        }

        mpp_assert(ctx->ext_line_buf_grp);
        setup_ext_line_bufs(ctx);
        ctx->ext_line_buf_size = ext_line_buf_size;
    } else {
        clear_ext_line_bufs(ctx);

        if (ctx->ext_line_buf_grp) {
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
            mpp_buffer_group_put(ctx->ext_line_buf_grp);
            ctx->ext_line_buf_grp = NULL;
        }
        ctx->ext_line_buf_size = 0;
    }

    if (frame_size > ctx->frame_size || new_max_cnt > old_max_cnt) {
        size_t size[4] = {0};
        RK_S32 ctu_w = (prep->width + 31) / 32;
        RK_S32 ctu_h = (prep->height + 31) / 32;

        hal_bufs_deinit(ctx->dpb_bufs);
        hal_bufs_init(&ctx->dpb_bufs);

        ctx->fbc_header_len = MPP_ALIGN(((mb_wd64 * mb_h64) << 6), SZ_8K);
        size[0] = ctx->fbc_header_len + ((mb_wd64 * mb_h64) << 12) * 3 / 2; //fbc_h + fbc_b
        size[1] = (mb_wd64 * mb_h64 << 8);
        size[2] = MPP_ALIGN(mb_wd64 * mb_h64 * 16 * 4, 256) * 16;
        /* smear bufs */
        size[3] = MPP_ALIGN(ctu_w, 16) * MPP_ALIGN(ctu_h, 16);
        new_max_cnt = MPP_MAX(new_max_cnt, old_max_cnt);

        hal_h265e_dbg_detail("frame size %d -> %d max count %d -> %d\n",
                             ctx->frame_size, frame_size, old_max_cnt, new_max_cnt);

        hal_bufs_setup(ctx->dpb_bufs, new_max_cnt, MPP_ARRAY_ELEMS(size), size);

        ctx->frame_size = frame_size;
        ctx->max_buf_cnt = new_max_cnt;
    }
    hal_h265e_leave();
    return ret;
}